

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

TypedParam * solver_params_get_val(SolverTypedParams *params,char *key,ParamType type)

{
  ParamType PVar1;
  TypedParam *pTVar2;
  char *pcVar3;
  char *pcVar4;
  
  pTVar2 = solver_params_get_key(params,key);
  if (pTVar2->count < 1) {
    log_log(0x80,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
            ,0x211,"Internal error. Tryed to unpack key `%s`, but its count is <= 0     (%d).",key);
    abort();
  }
  PVar1 = pTVar2->type;
  pcVar3 = param_type_as_str(type);
  if (PVar1 == type) {
    log_log(0x20,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
            ,0x21e,"Getting parameter `%s` as type `%s`",key,pcVar3);
    return pTVar2;
  }
  pcVar4 = param_type_as_str(pTVar2->type);
  log_log(0x80,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
          ,0x217,
          "Internal error. Tryed to unpack key `%s` as type `%s`, but the actual type is `%s`.",key,
          pcVar3,pcVar4);
  abort();
}

Assistant:

static inline TypedParam *solver_params_get_val(SolverTypedParams *params,
                                                char *key, ParamType type) {
    TypedParam *p = solver_params_get_key(params, key);
    if (p) {
        if (p->count <= 0) {
            log_fatal(
                "Internal error. Tryed to unpack key `%s`, but its count is <= "
                "0     (%d).",
                key, p->count);

            abort();
        } else if (p->type != type) {
            log_fatal("Internal error. Tryed to unpack key `%s` as type `%s`, "
                      "but the actual type is `%s`.",
                      key, param_type_as_str(type), param_type_as_str(p->type));

            abort();
        }
    }

    log_info("Getting parameter `%s` as type `%s`", key,
             param_type_as_str(type));
    return p;
}